

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtlp.c
# Opt level: O1

ssize_t dma_read(nettlp *nt,uintptr_t addr,void *buf,size_t count)

{
  int iVar1;
  uint uVar2;
  ssize_t sVar3;
  int *piVar4;
  ushort uVar5;
  uint uVar6;
  byte bVar7;
  ulong uVar8;
  undefined1 *__src;
  void *__dest;
  ulong uVar9;
  long lVar10;
  bool bVar11;
  tlp_cpl_hdr ch;
  pollfd x [1];
  uint64_t dst_addr64;
  iovec iov [4];
  nettlp_hdr nh;
  nettlp_hdr nh_1;
  char rest [16];
  undefined4 local_f0;
  ushort uStack_ec;
  uint8_t uStack_ea;
  byte bStack_e9;
  byte local_e4 [2];
  ushort local_e2;
  ushort local_de;
  byte local_d9;
  pollfd local_d8;
  ulong local_d0;
  iovec local_c8;
  byte *local_b8;
  undefined8 local_b0;
  void *local_a8;
  long local_a0;
  undefined1 *local_98;
  undefined8 local_90;
  undefined4 local_84;
  undefined2 local_80;
  undefined1 local_7e [6];
  iovec local_78;
  undefined4 *local_68;
  undefined8 local_60;
  ulong *local_58;
  undefined8 local_50;
  undefined1 local_48 [24];
  
  local_78.iov_base = &local_84;
  local_84 = 0;
  local_80 = 0;
  local_68 = &local_f0;
  local_78.iov_len = 6;
  local_60 = 8;
  uVar6 = (uint)addr;
  if (addr < 0xffffffff) {
    local_f0 = 0;
    local_d0 = CONCAT44(local_d0._4_4_,
                        uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 |
                        (uVar6 & 0xfffffffc) << 0x18);
    local_50 = 4;
  }
  else {
    local_d0 = addr >> 0x38 | (addr & 0xff000000000000) >> 0x28 | (addr & 0xff0000000000) >> 0x18 |
               (addr & 0xff00000000) >> 8 | (addr & 0xff000000) << 8 | (addr & 0xff0000) << 0x18 |
               (addr & 0xff00) << 0x28 | (addr & 0xfc) << 0x38;
    local_f0 = 0x20;
    local_50 = 8;
  }
  local_58 = &local_d0;
  uVar8 = count + addr;
  bVar11 = (uVar8 & 3) != 0;
  uVar9 = (count - 4) + addr;
  if (bVar11) {
    uVar9 = uVar8 & 0xfffffffffffffffc;
  }
  if (uVar9 <= (addr & 0xfffffffffffffffc)) {
    uVar9 = addr + 4;
  }
  bVar7 = ~(byte)(0xf << ((char)uVar8 - (char)uVar9 & 0x1fU)) << 4;
  if (uVar8 < uVar9) {
    bVar7 = 0;
  }
  uVar2 = ~(0xf << ((byte)count & 0x1f)) & 7;
  if (3 < count) {
    uVar2 = 0xf;
  }
  _local_f0 = CONCAT17((byte)(uVar2 << ((byte)addr & 3)) & 0xf | bVar7,
                       CONCAT16(nt->tag,CONCAT24(nt->requester << 8 | nt->requester >> 8,local_f0)))
  ;
  uVar5 = (ushort)bVar11 + (short)((int)uVar8 - (uVar6 & 0x3fffc) >> 2);
  local_f0 = CONCAT22(uVar5 * 0x100 | uVar5 >> 8,(undefined2)local_f0);
  sVar3 = writev(nt->sockfd,&local_78,3);
  iVar1 = (int)sVar3;
  if (-1 < iVar1) {
    local_c8.iov_base = local_7e;
    local_c8.iov_len = 6;
    local_b8 = local_e4;
    local_b0 = 0xc;
    local_98 = local_48;
    local_90 = 0x10;
    local_d8.fd = nt->sockfd;
    local_d8.events = 1;
    iVar1 = poll(&local_d8,1,500);
    if (-1 < iVar1) {
      lVar10 = 0;
      do {
        if (iVar1 == 0) {
          iVar1 = 0x3e;
LAB_00103bee:
          piVar4 = __errno_location();
          *piVar4 = iVar1;
          iVar1 = -1;
          break;
        }
        if (((byte)local_d8.revents & 1) == 0) break;
        local_a8 = (void *)((long)buf + lVar10);
        local_a0 = count - lVar10;
        sVar3 = readv(nt->sockfd,&local_c8,4);
        iVar1 = (int)sVar3;
        if (iVar1 < 0) break;
        if ((local_e4[0] & 0x5f) != 0x4a) {
          iVar1 = 0x4a;
          goto LAB_00103bee;
        }
        uVar6 = (uint)(ushort)(local_de << 8 | local_de >> 8);
        if (0x1fff < uVar6) {
          uVar2 = uVar6 & 0xe000;
          if (uVar2 == 0x2000) {
            iVar1 = 0x5f;
          }
          else if (uVar2 == 0x4000) {
            iVar1 = 0x16;
          }
          else {
            if (uVar2 != 0x8000) goto LAB_00103b09;
            iVar1 = 0x67;
          }
          goto LAB_00103bee;
        }
LAB_00103b09:
        if ((local_d9 & 3) != 0) {
          iVar1 = (int)((ulong)local_d9 & 3);
          uVar2 = (int)local_a0 - iVar1;
          if ((int)uVar2 < 1) {
            __src = local_98 + (iVar1 - (int)local_a0);
            uVar6 = uVar6 & 0xfff;
            __dest = local_a8;
          }
          else {
            uVar8 = (ulong)(uVar2 & 0x7fffffff);
            memmove(local_a8,(void *)(((ulong)local_d9 & 3) + (long)local_a8),uVar8);
            uVar6 = local_d9 & 3;
            __src = local_98;
            __dest = (void *)(uVar8 + (long)local_a8);
          }
          memmove(__dest,__src,(ulong)uVar6);
        }
        uVar6 = (uint)(ushort)(local_e2 << 8 | local_e2 >> 8);
        uVar5 = (local_de & 0xff0f) << 8 | local_de >> 8;
        if ((local_d9 & 3) + (uint)uVar5 + 3 >> 2 == (uVar6 & 0x3ff)) {
          return lVar10 + (ulong)uVar5;
        }
        lVar10 = lVar10 + (ulong)(uVar6 & 0x3ff) * 4;
        iVar1 = poll(&local_d8,1,500);
      } while (-1 < iVar1);
    }
  }
  return (long)iVar1;
}

Assistant:

ssize_t dma_read(struct nettlp *nt, uintptr_t addr, void *buf, size_t count)
{
	int ret;
	struct iovec iov[3];
	struct nettlp_hdr nh;
	struct tlp_mr_hdr mh;
	uint64_t dst_addr64;
	uint32_t dst_addr32;

	memset(&nh, 0, sizeof(nh));
	memset(&mh, 0, sizeof(mh));

	iov[0].iov_base = &nh;
	iov[0].iov_len = sizeof(nh);
	iov[1].iov_base = &mh;
	iov[1].iov_len = sizeof(mh);

	/* build memory read request  */
	tlp_set_type(mh.tlp.fmt_type, TLP_TYPE_MRd);
	if (addr < UINT32_MAX) {
		tlp_set_fmt(mh.tlp.fmt_type, TLP_FMT_3DW, TLP_FMT_WO_DATA);
		dst_addr32 = htobe32(addr & 0xFFFFFFFC);
		iov[2].iov_base = &dst_addr32;
		iov[2].iov_len = sizeof(dst_addr32);
	} else {
		tlp_set_fmt(mh.tlp.fmt_type, TLP_FMT_4DW, TLP_FMT_WO_DATA);
		dst_addr64 = htobe64(addr & 0xFFFFFFFFFFFFFFFC);
		iov[2].iov_base = &dst_addr64;
		iov[2].iov_len = sizeof(dst_addr64);
	}
	mh.requester = ntohs(nt->requester);
	mh.tag = nt->tag;
	mh.lstdw = tlp_calculate_lstdw(addr, count);
	mh.fstdw = tlp_calculate_fstdw(addr, count);
	tlp_set_length(mh.tlp.falen, tlp_calculate_length(addr, count));
	

	ret = writev(nt->sockfd, iov, 3);
	if (ret < 0)
		return ret;

	return libtlp_read_cpld(nt, buf, count);
}